

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O0

void __thiscall Nes_Vrc6_Apu::load_state(Nes_Vrc6_Apu *this,vrc6_apu_state_t *in)

{
  long in_RSI;
  Nes_Vrc6_Apu *in_RDI;
  int r;
  Vrc6_Osc *osc;
  int i;
  int local_24;
  int local_14;
  
  reset(in_RDI);
  in_RDI->oscs[2].amp = (uint)*(byte *)(in_RSI + 9);
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      in_RDI->oscs[local_14].regs[local_24] =
           *(uint8_t *)(in_RSI + (long)local_14 * 3 + (long)local_24);
    }
    in_RDI->oscs[local_14].delay = (uint)*(ushort *)(in_RSI + 10 + (long)local_14 * 2);
    in_RDI->oscs[local_14].phase = (uint)*(byte *)(in_RSI + 0x10 + (long)local_14);
  }
  if (in_RDI->oscs[2].phase == 0) {
    in_RDI->oscs[2].phase = 1;
  }
  return;
}

Assistant:

void Nes_Vrc6_Apu::load_state( vrc6_apu_state_t const& in )
{
	reset();
	oscs [2].amp = in.saw_amp;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc& osc = oscs [i];
		for ( int r = 0; r < reg_count; r++ )
			osc.regs [r] = in.regs [i] [r];
		
		osc.delay = in.delays [i];
		osc.phase = in.phases [i];
	}
	if ( !oscs [2].phase )
		oscs [2].phase = 1;
}